

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O1

ssize_t __thiscall
QSocks5SocketEngine::read(QSocks5SocketEngine *this,int __fd,void *__buf,size_t __nbytes)

{
  long lVar1;
  SocketState SVar2;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  long in_FS_OFFSET;
  QByteArrayView QVar4;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if (*(int *)(lVar1 + 0xdc) == 3) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      sVar3 = (**(code **)(*(long *)this + 0xf8))
                        (this,CONCAT44(in_register_00000034,__fd),__buf,0,0);
      return sVar3;
    }
    goto LAB_0023f3a8;
  }
  if (*(int *)(lVar1 + 0xdc) == 1) {
    if (*(long *)(*(long *)(lVar1 + 0x100) + 0x28) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        sVar3 = QRingBuffer::read((char *)(*(long *)(lVar1 + 0x100) + 0x10),
                                  CONCAT44(in_register_00000034,__fd));
        return sVar3;
      }
      goto LAB_0023f3a8;
    }
    SVar2 = QAbstractSocket::state((QAbstractSocket *)**(undefined8 **)(lVar1 + 0xf8));
    if (SVar2 != UnconnectedState) goto LAB_0023f30a;
    (**(code **)(*(long *)this + 0xa8))(this);
    QVar4.m_data = (storage_type *)0x1d;
    QVar4.m_size = (qsizetype)&local_38;
    QString::fromLatin1(QVar4);
    local_58.d.d = (Data *)local_38;
    local_58.d.ptr = pcStack_30;
    local_58.d.size = local_28;
    QAbstractSocketEngine::setError((QAbstractSocketEngine *)this,RemoteHostClosedError,&local_58);
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
    QAbstractSocketEngine::setState((QAbstractSocketEngine *)this,UnconnectedState);
    sVar3 = -1;
  }
  else {
LAB_0023f30a:
    sVar3 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar3;
  }
LAB_0023f3a8:
  __stack_chk_fail();
}

Assistant:

qint64 QSocks5SocketEngine::read(char *data, qint64 maxlen)
{
    Q_D(QSocks5SocketEngine);
    QSOCKS5_Q_DEBUG << "read( , maxlen = " << maxlen << ')';
    if (d->mode == QSocks5SocketEnginePrivate::ConnectMode) {
        if (d->connectData->readBuffer.isEmpty()) {
            if (d->data->controlSocket->state() == QAbstractSocket::UnconnectedState) {
                //imitate remote closed
                close();
                setError(QAbstractSocket::RemoteHostClosedError,
                         "Remote host closed connection"_L1);
                setState(QAbstractSocket::UnconnectedState);
                return -1;
            } else {
                return 0;       // nothing to be read
            }
        }
        const qint64 copy = d->connectData->readBuffer.read(data, maxlen);
        QSOCKS5_DEBUG << "read" << dump(QByteArray(data, copy));
        return copy;
#ifndef QT_NO_UDPSOCKET
    } else if (d->mode == QSocks5SocketEnginePrivate::UdpAssociateMode) {
        return readDatagram(data, maxlen);
#endif
    }
    return 0;
}